

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_user.cpp
# Opt level: O2

int AF__PlayerInfo_SetLogNumber
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  char *pcVar1;
  
  if (numparam < 1) {
    pcVar1 = "(paramnum) < numparam";
  }
  else {
    if ((param->field_0).field_3.Type == '\x03') {
      if (numparam == 1) {
        pcVar1 = "(paramnum) < numparam";
      }
      else {
        if (param[1].field_0.field_3.Type == '\0') {
          player_t::SetLogNumber((player_t *)(param->field_0).field_1.a,param[1].field_0.i);
          return 0;
        }
        pcVar1 = "param[paramnum].Type == REGT_INT";
      }
      __assert_fail(pcVar1,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_user.cpp"
                    ,0x1ee,
                    "int AF__PlayerInfo_SetLogNumber(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    pcVar1 = "param[paramnum].Type == REGT_POINTER";
  }
  __assert_fail(pcVar1,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_user.cpp"
                ,0x1ed,
                "int AF__PlayerInfo_SetLogNumber(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
               );
}

Assistant:

DEFINE_ACTION_FUNCTION(_PlayerInfo, SetLogNumber)
{
	PARAM_SELF_STRUCT_PROLOGUE(player_t);
	PARAM_INT(log);
	self->SetLogNumber(log);
	return 0;
}